

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::String(String *this,char c,int len)

{
  uchar *__s;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (-1 < len) {
    (this->super_tagbstring).mlen = len + 1U;
    (this->super_tagbstring).slen = len;
    __s = (uchar *)malloc((ulong)(len + 1U));
    (this->super_tagbstring).data = __s;
    if (__s != (uchar *)0x0) {
      if (len != 0) {
        memset(__s,(uint)(byte)c,(ulong)(uint)len);
      }
      __s[(uint)len] = '\0';
      return;
    }
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
          "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
          ,0x55,"Failure in repeat(char) constructor");
  return;
}

Assistant:

String::String(char c, int len)
    {
        slen = mlen = 0; data = 0;
        if (len >= 0)
        {
            mlen = len + 1;
            slen = len;
            data = (uint8 * ) malloc(mlen);
        }
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in repeat(char) constructor");
        }
        else
        {
            if (slen > 0)    memset(data, c, slen);
            data[slen] = '\0';
        }
    }